

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_NewModeAdjust(void)

{
  C_InitConsole((screen->super_DSimpleCanvas).super_DCanvas.Width,
                (screen->super_DSimpleCanvas).super_DCanvas.Height,true);
  C_FlushDisplay();
  C_AdjustBottom();
  return;
}

Assistant:

void C_NewModeAdjust ()
{
	C_InitConsole (SCREENWIDTH, SCREENHEIGHT, true);
	C_FlushDisplay ();
	C_AdjustBottom ();
}